

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ObjMergeOrder(Nf_Man_t *p,int iObj)

{
  Nf_Cut_t **ppNVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  Gia_Man_t *pGVar5;
  undefined8 uVar6;
  uint *puVar7;
  Gia_Obj_t *pGVar8;
  Nf_Cut_t *pNVar9;
  Nf_Cut_t *pNVar10;
  Nf_Cut_t *pNVar11;
  Vec_Mem_t *pVVar12;
  word **ppwVar13;
  word wVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  float fVar18;
  int Count;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  void *pvVar25;
  void **ppvVar26;
  byte bVar27;
  int i;
  uint uVar28;
  Nf_Cut_t *pNVar29;
  char *__function;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  int *piVar34;
  Nf_Cut_t *pNVar35;
  long lVar36;
  Gia_Obj_t *pGVar37;
  Nf_Cut_t *pNVar38;
  int iVar39;
  ulong uVar40;
  int *piVar41;
  char *__file;
  long lVar42;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  word *pwVar51;
  uint uVar52;
  int iVar53;
  int iVar54;
  float FlowRefs;
  Nf_Cut_t *pCutsR [32];
  Nf_Cut_t pCuts2 [32];
  Nf_Cut_t pCuts1 [32];
  Nf_Cut_t pCuts0 [32];
  Nf_Cut_t pCuts [32];
  uint local_19dc;
  uint local_197c;
  ulong local_1968;
  int local_195c;
  ulong local_1958;
  Nf_Cut_t *local_1950;
  Nf_Cut_t *local_1948;
  ulong local_1940;
  Nf_Cut_t *local_1938 [32];
  Nf_Cut_t local_1838 [32];
  Nf_Cut_t local_1238 [32];
  Nf_Cut_t local_c38 [32];
  Nf_Cut_t local_638 [32];
  
  if (iObj < 0) {
LAB_006f4e3e:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar31 = (ulong)(uint)iObj;
  if (p->pGia->nObjs <= iObj) goto LAB_006f4e3e;
  uVar24 = iObj * 2;
  iVar19 = (p->vFlowRefs).nSize;
  if ((iVar19 <= (int)uVar24) || (iVar19 <= (int)(uVar24 | 1))) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  pGVar37 = p->pGia->pObjs + (uint)iObj;
  pfVar4 = (p->vFlowRefs).pArray;
  FlowRefs = pfVar4[uVar24] + pfVar4[uVar24 | 1];
  uVar24 = p->pPars->nLutSize;
  uVar23 = p->pPars->nCutNum;
  iVar19 = Nf_ManPrepareCuts(local_c38,p,iObj - (*(uint *)pGVar37 & 0x1fffffff),1);
  iVar20 = Nf_ManPrepareCuts(local_1238,p,iObj - (*(uint *)&pGVar37->field_0x4 & 0x1fffffff),1);
  uVar47 = *(ulong *)pGVar37;
  pGVar5 = p->pGia;
  if (pGVar5->pSibls == (int *)0x0) {
    iVar21 = 0;
  }
  else {
    iVar21 = pGVar5->pSibls[(uint)iObj];
  }
  uVar28 = (uint)uVar47 & 0x1fffffff;
  uVar22 = (uint)(uVar47 >> 0x20);
  if ((-1 < (int)(uint)uVar47 && uVar28 != 0x1fffffff) && uVar28 == (uVar22 & 0x1fffffff)) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x36d,"void Nf_ObjMergeOrder(Nf_Man_t *, int)");
  }
  if (0 < (int)uVar23) {
    pNVar29 = local_638;
    uVar40 = 0;
    do {
      local_1938[uVar40] = pNVar29;
      uVar40 = uVar40 + 1;
      pNVar29 = pNVar29 + 1;
    } while (uVar23 != uVar40);
  }
  local_1958 = uVar31;
  if (iVar21 == 0) {
    local_19dc = 0;
  }
  else {
    iVar39 = pGVar5->pSibls[(uint)iObj];
    if (((long)iVar39 < 0) || (pGVar5->nObjs <= iVar39)) goto LAB_006f4e3e;
    uVar31 = *(ulong *)pGVar37;
    uVar6 = *(undefined8 *)(pGVar5->pObjs + iVar39);
    pNVar29 = local_1838;
    local_19dc = 0;
    iVar21 = Nf_ManPrepareCuts(pNVar29,p,iVar21,0);
    if (0 < iVar21) {
      local_19dc = 0;
      do {
        pNVar38 = local_1938[(int)local_19dc];
        wVar14 = pNVar29->Sign;
        iVar33 = pNVar29->Delay;
        fVar18 = pNVar29->Flow;
        iVar39 = pNVar29->pLeaves[0];
        uVar15 = *(undefined8 *)(pNVar29->pLeaves + 1);
        uVar16 = *(undefined8 *)(pNVar29->pLeaves + 3);
        uVar17 = *(undefined8 *)(pNVar29->pLeaves + 5);
        *(undefined4 *)&pNVar38->field_0x10 = *(undefined4 *)&pNVar29->field_0x10;
        pNVar38->pLeaves[0] = iVar39;
        *(undefined8 *)(pNVar38->pLeaves + 1) = uVar15;
        *(undefined8 *)(pNVar38->pLeaves + 3) = uVar16;
        *(undefined8 *)(pNVar38->pLeaves + 5) = uVar17;
        pNVar38->Sign = wVar14;
        pNVar38->Delay = iVar33;
        pNVar38->Flow = fVar18;
        *(uint *)&pNVar38->field_0x10 =
             *(uint *)&pNVar38->field_0x10 & 0xfc000000 |
             *(uint *)&pNVar38->field_0x10 & 0x3ffffff ^
             ((uint)((ulong)uVar6 >> 0x20) ^ (uint)(uVar31 >> 0x20)) >> 0x1f;
        Nf_CutParams(p,pNVar38,FlowRefs);
        local_19dc = Nf_SetAddCut(local_1938,local_19dc,uVar23);
        pNVar29 = pNVar29 + 1;
      } while (pNVar29 < local_1838 + iVar21);
    }
  }
  uVar28 = (uint)(uVar47 >> 0x1d) & 1;
  local_1940 = (ulong)(uVar22 >> 0x1d & 1);
  local_1950 = local_c38 + iVar19;
  local_1948 = local_1238 + iVar20;
  puVar7 = p->pGia->pMuxes;
  if ((puVar7 == (uint *)0x0) || (puVar7[(uint)iObj] == 0)) {
    uVar31 = *(ulong *)pGVar37;
    uVar22 = (uint)uVar31;
    p->CutCount[0] = (double)(iVar20 * iVar19) + p->CutCount[0];
    if (0 < iVar19) {
      piVar41 = local_c38[0].pLeaves;
      pNVar29 = local_c38;
      do {
        if (0 < iVar20) {
          piVar34 = local_1238[0].pLeaves;
          pNVar38 = local_1238;
          do {
            uVar46 = *(uint *)&pNVar29->field_0x10;
            uVar43 = uVar46 >> 0x1b;
            uVar50 = *(uint *)&pNVar38->field_0x10;
            uVar45 = uVar50 >> 0x1b;
            if (((int)uVar24 < (int)(uVar45 + uVar43)) &&
               (uVar47 = pNVar38->Sign | pNVar29->Sign,
               uVar47 = uVar47 - (uVar47 >> 1 & 0x5555555555555555),
               uVar47 = (uVar47 >> 2 & 0x3333333333333333) + (uVar47 & 0x3333333333333333),
               (int)uVar24 <
               (int)(uint)(byte)(((uVar47 >> 4) + uVar47 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38))) goto LAB_006f40da;
            p->CutCount[1] = p->CutCount[1] + 1.0;
            pNVar35 = local_1938[(int)local_19dc];
            if ((uVar43 == uVar24) && (uVar45 == uVar24)) {
              uVar48 = uVar24;
              if (0x7ffffff < uVar46) {
                uVar47 = 0;
                do {
                  if (piVar41[uVar47] != piVar34[uVar47]) goto LAB_006f40da;
                  pNVar35->pLeaves[uVar47] = piVar41[uVar47];
                  uVar47 = uVar47 + 1;
                } while (uVar43 != uVar47);
              }
LAB_006f3b6b:
              *(uint *)&pNVar35->field_0x10 =
                   uVar48 * 0x8000000 + (*(uint *)&pNVar35->field_0x10 & 0x4000000) + 0x3ffffff;
              pNVar35->Sign = pNVar38->Sign | pNVar29->Sign;
              if (0 < (int)local_19dc) {
                pNVar9 = local_1938[local_19dc];
                uVar46 = *(uint *)&pNVar9->field_0x10 >> 0x1b;
                uVar47 = 0;
                do {
                  pNVar10 = local_1938[uVar47];
                  uVar50 = *(uint *)&pNVar10->field_0x10 >> 0x1b;
                  if ((uVar50 <= uVar46) && ((pNVar10->Sign & ~pNVar9->Sign) == 0)) {
                    if (uVar46 == uVar50) {
                      if (*(uint *)&pNVar9->field_0x10 < 0x8000000) goto LAB_006f40da;
                      uVar40 = 0;
                      while (pNVar9->pLeaves[uVar40] == pNVar10->pLeaves[uVar40]) {
                        uVar40 = uVar40 + 1;
                        if (uVar46 == uVar40) goto LAB_006f40da;
                      }
                    }
                    else {
                      if (uVar46 <= uVar50) {
LAB_006f4d46:
                        __assert_fail("nSizeB > nSizeC",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                                      ,0x303,"int Nf_SetCutIsContainedOrder(Nf_Cut_t *, Nf_Cut_t *)"
                                     );
                      }
                      if (*(uint *)&pNVar10->field_0x10 < 0x8000000) goto LAB_006f40da;
                      uVar40 = 0;
                      uVar43 = 0;
                      do {
                        if (pNVar10->pLeaves[(int)uVar43] < pNVar9->pLeaves[uVar40]) break;
                        if ((pNVar9->pLeaves[uVar40] == pNVar10->pLeaves[(int)uVar43]) &&
                           (uVar43 = uVar43 + 1, uVar43 == uVar50)) goto LAB_006f40da;
                        uVar40 = uVar40 + 1;
                      } while (uVar46 != uVar40);
                    }
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 != local_19dc);
              }
              p->CutCount[2] = p->CutCount[2] + 1.0;
              pVVar12 = p->vTtMem;
              uVar46 = *(uint *)&pNVar29->field_0x10;
              uVar50 = uVar46 >> 1 & 0x1ffffff;
              if (pVVar12->nEntries <= (int)uVar50) {
LAB_006f4d27:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              uVar43 = *(uint *)&pNVar38->field_0x10;
              uVar45 = uVar43 >> 1 & 0x1ffffff;
              if (pVVar12->nEntries <= (int)uVar45) goto LAB_006f4d27;
              uVar48 = *(uint *)&pNVar35->field_0x10;
              bVar27 = (byte)pVVar12->LogPageSze;
              uVar2 = uVar48 >> 0x1b;
              uVar47 = (ulong)uVar2;
              uVar40 = -(ulong)((uVar46 & 1) != uVar28) ^
                       pVVar12->ppPages[uVar50 >> (bVar27 & 0x1f)]
                       [(int)((uVar50 & pVVar12->PageMask) * pVVar12->nEntrySize)];
              uVar44 = -(ulong)((uVar43 & 1) != (uint)local_1940) ^
                       pVVar12->ppPages[uVar45 >> (bVar27 & 0x1f)]
                       [(int)((pVVar12->PageMask & uVar45) * pVVar12->nEntrySize)];
              uVar50 = (uVar46 >> 0x1b) - 1;
              if (0x7ffffff < uVar46 && 0x7ffffff < uVar48) {
                lVar42 = uVar47 * 0x18 + 0x92f8f8;
                uVar30 = uVar47;
                do {
                  uVar32 = uVar30 - 1;
                  if (pNVar35->pLeaves[uVar30 - 1] <= pNVar29->pLeaves[uVar50]) {
                    if (pNVar35->pLeaves[uVar30 - 1] != pNVar29->pLeaves[uVar50]) goto LAB_006f4ce9;
                    if ((long)(int)uVar50 < (long)uVar32) {
                      bVar27 = (char)(-1 << ((byte)uVar50 & 0x1f)) +
                               (char)(1 << ((byte)uVar32 & 0x1f));
                      lVar36 = (ulong)uVar50 * 0x90;
                      uVar40 = (uVar40 & *(ulong *)(lVar42 + lVar36)) >> (bVar27 & 0x3f) |
                               (*(ulong *)(lVar42 + -8 + lVar36) & uVar40) << (bVar27 & 0x3f) |
                               *(ulong *)(lVar42 + -0x10 + lVar36) & uVar40;
                    }
                    uVar50 = uVar50 - 1;
                  }
                } while ((1 < (long)uVar30) &&
                        (lVar42 = lVar42 + -0x18, uVar30 = uVar32, -1 < (int)uVar50));
              }
              if (uVar50 != 0xffffffff) {
LAB_006f4d08:
                __assert_fail("k == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                              ,0x594,"word Abc_Tt6Expand(word, int *, int, int *, int)");
              }
              uVar46 = (uVar43 >> 0x1b) - 1;
              if (0x7ffffff < uVar43 && 0x7ffffff < uVar48) {
                lVar42 = uVar47 * 0x18 + 0x92f8f8;
                uVar30 = uVar47;
                do {
                  uVar32 = uVar30 - 1;
                  if (pNVar35->pLeaves[uVar30 - 1] <= pNVar38->pLeaves[uVar46]) {
                    if (pNVar35->pLeaves[uVar30 - 1] != pNVar38->pLeaves[uVar46]) {
LAB_006f4ce9:
                      __assert_fail("pCut[i] == pCut0[k]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                    ,0x58f,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                    }
                    if ((long)(int)uVar46 < (long)uVar32) {
                      bVar27 = (char)(-1 << ((byte)uVar46 & 0x1f)) +
                               (char)(1 << ((byte)uVar32 & 0x1f));
                      lVar36 = (ulong)uVar46 * 0x90;
                      uVar44 = (uVar44 & *(ulong *)(lVar42 + lVar36)) >> (bVar27 & 0x3f) |
                               (*(ulong *)(lVar42 + -8 + lVar36) & uVar44) << (bVar27 & 0x3f) |
                               *(ulong *)(lVar42 + -0x10 + lVar36) & uVar44;
                    }
                    uVar46 = uVar46 - 1;
                  }
                } while ((1 < (long)uVar30) &&
                        (lVar42 = lVar42 + -0x18, uVar30 = uVar32, -1 < (int)uVar46));
              }
              if (uVar46 != 0xffffffff) goto LAB_006f4d08;
              local_1838[0].Sign = uVar44 & uVar40;
              if (((~uVar22 & 0x1fffffff) != 0 && -1 < (int)uVar22) &&
                  (uVar22 & 0x1fffffff) < ((uint)(uVar31 >> 0x20) & 0x1fffffff)) {
                local_1838[0].Sign = uVar44 ^ uVar40;
              }
              uVar46 = (uint)local_1838[0].Sign & 1;
              local_1838[0].Sign = -(ulong)uVar46 ^ local_1838[0].Sign;
              uVar50 = 0;
              uVar40 = local_1838[0].Sign;
              if (0x7ffffff < uVar48) {
                uVar44 = 0;
                lVar42 = 0x92f908;
                pwVar51 = s_Truths6Neg;
                uVar50 = 0;
                do {
                  bVar27 = (byte)(1 << ((byte)uVar44 & 0x1f));
                  if ((*pwVar51 & (uVar40 >> (bVar27 & 0x3f) ^ uVar40)) != 0) {
                    lVar36 = (long)(int)uVar50;
                    if (lVar36 < (long)uVar44) {
                      pNVar35->pLeaves[lVar36] = pNVar35->pLeaves[uVar44];
                      bVar27 = (char)(-1 << ((byte)uVar50 & 0x1f)) + bVar27;
                      lVar36 = lVar36 * 0x90;
                      uVar40 = (uVar40 & *(ulong *)(lVar42 + 8 + lVar36)) >> (bVar27 & 0x3f) |
                               (*(ulong *)(lVar42 + lVar36) & uVar40) << (bVar27 & 0x3f) |
                               *(ulong *)(lVar42 + -8 + lVar36) & uVar40;
                    }
                    uVar50 = uVar50 + 1;
                  }
                  uVar44 = uVar44 + 1;
                  pwVar51 = pwVar51 + 1;
                  lVar42 = lVar42 + 0x18;
                } while (uVar47 != uVar44);
              }
              uVar47 = local_1838[0].Sign;
              if ((uVar50 != uVar2) &&
                 (uVar44 = local_1968, uVar47 = uVar40, (int)uVar2 <= (int)uVar50)) {
LAB_006f4dc2:
                local_1968 = uVar44;
                __assert_fail("k < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                              ,0x5b6,"int Abc_Tt6MinBase(word *, int *, int)");
              }
              local_1838[0].Sign = uVar47;
              *(uint *)&pNVar35->field_0x10 =
                   *(uint *)&pNVar35->field_0x10 & 0x7ffffff | uVar50 << 0x1b;
              if ((local_1838[0].Sign & 1) != 0) {
                __assert_fail("(int)(t & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x1d0,
                              "int Nf_CutComputeTruth6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, Nf_Cut_t *, int)"
                             );
              }
              uVar50 = Vec_MemHashInsert(p->vTtMem,&local_1838[0].Sign);
              if ((int)uVar50 < 0) {
LAB_006f4d65:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10b,"int Abc_Var2Lit(int, int)");
              }
              uVar43 = *(uint *)&pNVar35->field_0x10;
              uVar46 = uVar43 & 0xfc000000 | uVar46 + (uVar50 & 0x1ffffff) * 2;
              *(uint *)&pNVar35->field_0x10 = uVar46;
              *(uint *)&pNVar35->field_0x10 =
                   uVar46 & 0xfbffffff | (uint)(p->vTt2Match->nSize <= (int)uVar50) << 0x1a;
              if (uVar2 < uVar43 >> 0x1b) {
                __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x1d4,
                              "int Nf_CutComputeTruth6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, Nf_Cut_t *, int)"
                             );
              }
              if (uVar43 >> 0x1b < uVar2) {
                if (uVar43 < 0x8000000) {
                  uVar47 = 0;
                }
                else {
                  uVar40 = 0;
                  uVar47 = 0;
                  do {
                    uVar47 = uVar47 | 1L << ((ulong)(byte)pNVar35->pLeaves[uVar40] & 0x3f);
                    uVar40 = uVar40 + 1;
                  } while (uVar43 >> 0x1b != uVar40);
                }
                pNVar35->Sign = uVar47;
              }
              Nf_CutParams(p,pNVar35,FlowRefs);
              local_19dc = Nf_SetAddCut(local_1938,local_19dc,uVar23);
            }
            else {
              iVar19 = 0;
              uVar48 = 0;
              if (uVar46 < 0x8000000) {
LAB_006f3ace:
                if ((int)(uVar48 + uVar45) <= (int)(iVar19 + uVar24)) {
                  if (iVar19 < (int)uVar45) {
                    lVar42 = 0;
                    do {
                      pNVar35->pLeaves[(int)uVar48 + lVar42] = piVar34[iVar19 + lVar42];
                      lVar42 = lVar42 + 1;
                    } while ((ulong)uVar45 - (long)iVar19 != lVar42);
LAB_006f3b69:
                    uVar48 = uVar48 + (int)lVar42;
                  }
                  goto LAB_006f3b6b;
                }
              }
              else {
                iVar21 = 0;
                uVar48 = 0;
                if (uVar50 < 0x8000000) {
LAB_006f3b25:
                  if ((int)(uVar48 + uVar43) <= (int)(iVar21 + uVar24)) {
                    if (iVar21 < (int)uVar43) {
                      lVar42 = 0;
                      do {
                        pNVar35->pLeaves[(int)uVar48 + lVar42] = piVar41[iVar21 + lVar42];
                        lVar42 = lVar42 + 1;
                      } while ((ulong)uVar43 - (long)iVar21 != lVar42);
                      goto LAB_006f3b69;
                    }
                    goto LAB_006f3b6b;
                  }
                }
                else if (uVar24 != 0) {
                  lVar42 = 0;
                  iVar21 = 0;
                  iVar39 = 0;
                  do {
                    iVar19 = pNVar29->pLeaves[iVar21];
                    iVar33 = pNVar38->pLeaves[iVar39];
                    if (iVar19 < iVar33) {
                      iVar21 = iVar21 + 1;
                      pNVar35->pLeaves[lVar42] = iVar19;
                      iVar19 = iVar39;
                      if ((int)uVar43 <= iVar21) {
LAB_006f40f2:
                        uVar48 = (int)lVar42 + 1;
                        goto LAB_006f3ace;
                      }
                    }
                    else {
                      if (iVar33 < iVar19) {
                        pNVar35->pLeaves[lVar42] = iVar33;
                      }
                      else {
                        iVar21 = iVar21 + 1;
                        pNVar35->pLeaves[lVar42] = iVar19;
                        iVar19 = iVar39 + 1;
                        if ((int)uVar43 <= iVar21) goto LAB_006f40f2;
                      }
                      iVar39 = iVar39 + 1;
                      if ((int)uVar45 <= iVar39) {
                        uVar48 = (int)lVar42 + 1;
                        goto LAB_006f3b25;
                      }
                    }
                    lVar42 = lVar42 + 1;
                  } while (uVar24 != (uint)lVar42);
                }
              }
            }
LAB_006f40da:
            pNVar38 = pNVar38 + 1;
            piVar34 = piVar34 + 0xc;
          } while (pNVar38 < local_1948);
        }
        pNVar29 = pNVar29 + 1;
        piVar41 = piVar41 + 0xc;
      } while (pNVar29 < local_1950);
    }
  }
  else {
    puVar7 = p->pGia->pMuxes;
    uVar22 = 0xffffffff;
    if (puVar7 != (uint *)0x0) {
      uVar46 = puVar7[(uint)iObj];
      if (uVar46 != 0) {
        if ((int)uVar46 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        uVar22 = uVar46 >> 1;
      }
    }
    iVar21 = Nf_ManPrepareCuts(local_1838,p,uVar22,1);
    pGVar5 = p->pGia;
    if (pGVar5->pMuxes == (uint *)0x0) {
      local_197c = 0;
    }
    else {
      pGVar8 = pGVar5->pObjs;
      if ((pGVar37 < pGVar8) || (pGVar8 + pGVar5->nObjs <= pGVar37)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      local_197c = pGVar5->pMuxes[(int)((ulong)((long)pGVar37 - (long)pGVar8) >> 2) * -0x55555555];
      if ((int)local_197c < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10d,"int Abc_LitIsCompl(int)");
      }
      local_197c = local_197c & 1;
    }
    p->CutCount[0] = (double)(iVar20 * iVar19 * iVar21) + p->CutCount[0];
    if (0 < iVar19) {
      pNVar29 = local_c38;
      local_195c = iVar21;
      do {
        if (0 < iVar20) {
          pNVar38 = local_1238;
          do {
            if (0 < local_195c) {
              pNVar35 = local_1838;
              do {
                uVar31 = pNVar38->Sign | pNVar29->Sign | pNVar35->Sign;
                uVar31 = uVar31 - (uVar31 >> 1 & 0x5555555555555555);
                uVar31 = (uVar31 >> 2 & 0x3333333333333333) + (uVar31 & 0x3333333333333333);
                if ((int)(uint)(byte)(((uVar31 >> 4) + uVar31 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38) <= (int)uVar24) {
                  p->CutCount[1] = p->CutCount[1] + 1.0;
                  pNVar9 = local_1938[(int)local_19dc];
                  uVar22 = *(uint *)&pNVar29->field_0x10;
                  uVar46 = *(uint *)&pNVar38->field_0x10;
                  uVar50 = *(uint *)&pNVar35->field_0x10;
                  uVar31 = 0;
                  iVar19 = -0x3ffffff;
                  uVar43 = 0;
                  uVar45 = 0;
                  uVar48 = 0;
                  while( true ) {
                    iVar33 = 1000000000;
                    iVar39 = 1000000000;
                    if (uVar48 != uVar22 >> 0x1b) {
                      iVar39 = pNVar29->pLeaves[uVar48];
                    }
                    if (uVar45 != uVar46 >> 0x1b) {
                      iVar33 = pNVar38->pLeaves[uVar45];
                    }
                    iVar53 = 1000000000;
                    if (uVar43 != uVar50 >> 0x1b) {
                      iVar53 = pNVar35->pLeaves[uVar43];
                    }
                    iVar49 = iVar33;
                    if (iVar39 < iVar33) {
                      iVar49 = iVar39;
                    }
                    iVar54 = iVar53;
                    if (iVar49 < iVar53) {
                      iVar54 = iVar49;
                    }
                    if (iVar54 == 1000000000) break;
                    if (uVar24 == uVar31) goto LAB_006f4342;
                    pNVar9->pLeaves[uVar31] = iVar54;
                    uVar31 = uVar31 + 1;
                    uVar48 = uVar48 + (iVar39 == iVar54);
                    uVar45 = uVar45 + (iVar33 == iVar54);
                    uVar43 = uVar43 + (iVar53 <= iVar49);
                    iVar19 = iVar19 + -0x8000000;
                  }
                  *(uint *)&pNVar9->field_0x10 = (*(uint *)&pNVar9->field_0x10 & 0x4000000) - iVar19
                  ;
                  pNVar9->Sign = pNVar38->Sign | pNVar29->Sign | pNVar35->Sign;
LAB_006f4342:
                  if (iVar54 == 1000000000) {
                    if (0 < (int)local_19dc) {
                      pNVar10 = local_1938[local_19dc];
                      uVar22 = *(uint *)&pNVar10->field_0x10 >> 0x1b;
                      uVar31 = 0;
                      do {
                        pNVar11 = local_1938[uVar31];
                        uVar46 = *(uint *)&pNVar11->field_0x10 >> 0x1b;
                        if ((uVar46 <= uVar22) && ((pNVar11->Sign & ~pNVar10->Sign) == 0)) {
                          if (uVar22 == uVar46) {
                            if (*(uint *)&pNVar10->field_0x10 < 0x8000000) goto LAB_006f49d6;
                            uVar47 = 0;
                            while (pNVar10->pLeaves[uVar47] == pNVar11->pLeaves[uVar47]) {
                              uVar47 = uVar47 + 1;
                              if (uVar22 == uVar47) goto LAB_006f49d6;
                            }
                          }
                          else {
                            if (uVar22 <= uVar46) goto LAB_006f4d46;
                            if (*(uint *)&pNVar11->field_0x10 < 0x8000000) goto LAB_006f49d6;
                            uVar47 = 0;
                            uVar50 = 0;
                            do {
                              if (pNVar11->pLeaves[(int)uVar50] < pNVar10->pLeaves[uVar47]) break;
                              if ((pNVar10->pLeaves[uVar47] == pNVar11->pLeaves[(int)uVar50]) &&
                                 (uVar50 = uVar50 + 1, uVar50 == uVar46)) goto LAB_006f49d6;
                              uVar47 = uVar47 + 1;
                            } while (uVar22 != uVar47);
                          }
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != local_19dc);
                    }
                    p->CutCount[2] = p->CutCount[2] + 1.0;
                    pVVar12 = p->vTtMem;
                    uVar22 = *(uint *)&pNVar29->field_0x10;
                    uVar46 = uVar22 >> 1 & 0x1ffffff;
                    iVar19 = pVVar12->nEntries;
                    if (iVar19 <= (int)uVar46) goto LAB_006f4d27;
                    bVar27 = (byte)pVVar12->LogPageSze;
                    uVar50 = *(uint *)&pNVar38->field_0x10;
                    uVar43 = uVar50 >> 1 & 0x1ffffff;
                    if (iVar19 <= (int)uVar43) goto LAB_006f4d27;
                    uVar45 = *(uint *)&pNVar35->field_0x10;
                    uVar48 = uVar45 >> 1 & 0x1ffffff;
                    if (iVar19 <= (int)uVar48) goto LAB_006f4d27;
                    uVar2 = *(uint *)&pNVar9->field_0x10;
                    uVar52 = uVar2 >> 0x1b;
                    uVar40 = (ulong)uVar52;
                    ppwVar13 = pVVar12->ppPages;
                    iVar19 = pVVar12->nEntrySize;
                    uVar3 = pVVar12->PageMask;
                    uVar44 = -(ulong)((uVar22 & 1) != uVar28) ^
                             ppwVar13[uVar46 >> (bVar27 & 0x1f)][(int)((uVar46 & uVar3) * iVar19)];
                    uVar31 = -(ulong)((uVar50 & 1) != (uint)local_1940) ^
                             ppwVar13[uVar43 >> (bVar27 & 0x1f)][(int)((uVar43 & uVar3) * iVar19)];
                    uVar47 = -(ulong)((uVar45 & 1) != local_197c) ^
                             ppwVar13[uVar48 >> (bVar27 & 0x1f)][(int)((uVar48 & uVar3) * iVar19)];
                    uVar46 = (uVar22 >> 0x1b) - 1;
                    if (0x7ffffff < uVar22 && 0x7ffffff < uVar2) {
                      lVar42 = uVar40 * 0x18 + 0x92f8f8;
                      uVar30 = uVar40;
                      do {
                        uVar32 = uVar30 - 1;
                        if (pNVar9->pLeaves[uVar30 - 1] <= pNVar29->pLeaves[uVar46]) {
                          if (pNVar9->pLeaves[uVar30 - 1] != pNVar29->pLeaves[uVar46])
                          goto LAB_006f4ce9;
                          if ((long)(int)uVar46 < (long)uVar32) {
                            bVar27 = (char)(-1 << ((byte)uVar46 & 0x1f)) +
                                     (char)(1 << ((byte)uVar32 & 0x1f));
                            lVar36 = (ulong)uVar46 * 0x90;
                            uVar44 = (uVar44 & *(ulong *)(lVar42 + lVar36)) >> (bVar27 & 0x3f) |
                                     (*(ulong *)(lVar42 + -8 + lVar36) & uVar44) << (bVar27 & 0x3f)
                                     | *(ulong *)(lVar42 + -0x10 + lVar36) & uVar44;
                          }
                          uVar46 = uVar46 - 1;
                        }
                      } while ((1 < (long)uVar30) &&
                              (lVar42 = lVar42 + -0x18, uVar30 = uVar32, -1 < (int)uVar46));
                    }
                    if (uVar46 != 0xffffffff) goto LAB_006f4d08;
                    uVar22 = (uVar50 >> 0x1b) - 1;
                    if (0x7ffffff < uVar50 && 0x7ffffff < uVar2) {
                      lVar42 = uVar40 * 0x18 + 0x92f8f8;
                      uVar30 = uVar40;
                      do {
                        uVar32 = uVar30 - 1;
                        if (pNVar9->pLeaves[uVar30 - 1] <= pNVar38->pLeaves[uVar22]) {
                          if (pNVar9->pLeaves[uVar30 - 1] != pNVar38->pLeaves[uVar22])
                          goto LAB_006f4ce9;
                          if ((long)(int)uVar22 < (long)uVar32) {
                            bVar27 = (char)(-1 << ((byte)uVar22 & 0x1f)) +
                                     (char)(1 << ((byte)uVar32 & 0x1f));
                            lVar36 = (ulong)uVar22 * 0x90;
                            uVar31 = (uVar31 & *(ulong *)(lVar42 + lVar36)) >> (bVar27 & 0x3f) |
                                     (*(ulong *)(lVar42 + -8 + lVar36) & uVar31) << (bVar27 & 0x3f)
                                     | *(ulong *)(lVar42 + -0x10 + lVar36) & uVar31;
                          }
                          uVar22 = uVar22 - 1;
                        }
                      } while ((1 < (long)uVar30) &&
                              (lVar42 = lVar42 + -0x18, uVar30 = uVar32, -1 < (int)uVar22));
                    }
                    if (uVar22 != 0xffffffff) goto LAB_006f4d08;
                    uVar22 = (uVar45 >> 0x1b) - 1;
                    if (0x7ffffff < uVar45 && 0x7ffffff < uVar2) {
                      lVar42 = uVar40 * 0x18 + 0x92f8f8;
                      uVar30 = uVar40;
                      do {
                        uVar32 = uVar30 - 1;
                        if (pNVar9->pLeaves[uVar30 - 1] <= pNVar35->pLeaves[uVar22]) {
                          if (pNVar9->pLeaves[uVar30 - 1] != pNVar35->pLeaves[uVar22])
                          goto LAB_006f4ce9;
                          if ((long)(int)uVar22 < (long)uVar32) {
                            bVar27 = (char)(-1 << ((byte)uVar22 & 0x1f)) +
                                     (char)(1 << ((byte)uVar32 & 0x1f));
                            lVar36 = (ulong)uVar22 * 0x90;
                            uVar47 = (uVar47 & *(ulong *)(lVar42 + lVar36)) >> (bVar27 & 0x3f) |
                                     (*(ulong *)(lVar42 + -8 + lVar36) & uVar47) << (bVar27 & 0x3f)
                                     | *(ulong *)(lVar42 + -0x10 + lVar36) & uVar47;
                          }
                          uVar22 = uVar22 - 1;
                        }
                      } while ((1 < (long)uVar30) &&
                              (lVar42 = lVar42 + -0x18, uVar30 = uVar32, -1 < (int)uVar22));
                    }
                    if (uVar22 != 0xffffffff) goto LAB_006f4d08;
                    uVar44 = (uVar31 ^ uVar44) & uVar47 ^ uVar44;
                    uVar22 = (uint)uVar44 & 1;
                    uVar44 = -(ulong)uVar22 ^ uVar44;
                    uVar46 = 0;
                    uVar31 = uVar44;
                    if (0x7ffffff < uVar2) {
                      uVar47 = 0;
                      lVar42 = 0x92f908;
                      pwVar51 = s_Truths6Neg;
                      uVar46 = 0;
                      do {
                        bVar27 = (byte)(1 << ((byte)uVar47 & 0x1f));
                        if ((*pwVar51 & (uVar31 >> (bVar27 & 0x3f) ^ uVar31)) != 0) {
                          lVar36 = (long)(int)uVar46;
                          if (lVar36 < (long)uVar47) {
                            pNVar9->pLeaves[lVar36] = pNVar9->pLeaves[uVar47];
                            bVar27 = (char)(-1 << ((byte)uVar46 & 0x1f)) + bVar27;
                            lVar36 = lVar36 * 0x90;
                            uVar31 = (uVar31 & *(ulong *)(lVar42 + 8 + lVar36)) >> (bVar27 & 0x3f) |
                                     (*(ulong *)(lVar42 + lVar36) & uVar31) << (bVar27 & 0x3f) |
                                     *(ulong *)(lVar42 + -8 + lVar36) & uVar31;
                          }
                          uVar46 = uVar46 + 1;
                        }
                        uVar47 = uVar47 + 1;
                        pwVar51 = pwVar51 + 1;
                        lVar42 = lVar42 + 0x18;
                      } while (uVar40 != uVar47);
                    }
                    local_1968 = uVar44;
                    if ((uVar46 != uVar52) && (local_1968 = uVar31, (int)uVar52 <= (int)uVar46))
                    goto LAB_006f4dc2;
                    *(uint *)&pNVar9->field_0x10 =
                         *(uint *)&pNVar9->field_0x10 & 0x7ffffff | uVar46 << 0x1b;
                    if ((local_1968 & 1) != 0) {
                      __assert_fail("(int)(t & 1) == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                                    ,0x1e6,
                                    "int Nf_CutComputeTruthMux6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, int, Nf_Cut_t *)"
                                   );
                    }
                    uVar46 = Vec_MemHashInsert(p->vTtMem,&local_1968);
                    if ((int)uVar46 < 0) goto LAB_006f4d65;
                    uVar50 = *(uint *)&pNVar9->field_0x10;
                    uVar22 = uVar50 & 0xfc000000 | uVar22 + (uVar46 & 0x1ffffff) * 2;
                    *(uint *)&pNVar9->field_0x10 = uVar22;
                    *(uint *)&pNVar9->field_0x10 =
                         uVar22 & 0xfbffffff | (uint)(p->vTt2Match->nSize <= (int)uVar46) << 0x1a;
                    if (uVar52 < uVar50 >> 0x1b) {
                      __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                                    ,0x1ea,
                                    "int Nf_CutComputeTruthMux6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, int, Nf_Cut_t *)"
                                   );
                    }
                    if (uVar50 >> 0x1b < uVar52) {
                      if (uVar50 < 0x8000000) {
                        uVar31 = 0;
                      }
                      else {
                        uVar47 = 0;
                        uVar31 = 0;
                        do {
                          uVar31 = uVar31 | 1L << ((ulong)(byte)pNVar9->pLeaves[uVar47] & 0x3f);
                          uVar47 = uVar47 + 1;
                        } while (uVar50 >> 0x1b != uVar47);
                      }
                      pNVar9->Sign = uVar31;
                    }
                    Nf_CutParams(p,pNVar9,FlowRefs);
                    local_19dc = Nf_SetAddCut(local_1938,local_19dc,uVar23);
                  }
                }
LAB_006f49d6:
                pNVar35 = pNVar35 + 1;
              } while (pNVar35 < local_1838 + iVar21);
            }
            pNVar38 = pNVar38 + 1;
          } while (pNVar38 < local_1948);
        }
        pNVar29 = pNVar29 + 1;
      } while (pNVar29 < local_1950);
    }
  }
  if (((int)local_19dc < 1) || ((int)uVar23 <= (int)local_19dc)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x3b8,"void Nf_ObjMergeOrder(Nf_Man_t *, int)");
  }
  if ((p->vCutFlows).nSize <= (int)local_1958) {
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
    ;
    __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
    goto LAB_006f4ee6;
  }
  (p->vCutFlows).pArray[(uint)iObj] = local_1938[0]->Flow;
  if ((p->vCutDelays).nSize <= (int)local_1958) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (p->vCutDelays).pArray[(uint)iObj] = local_1938[0]->Delay;
  uVar47 = (ulong)local_19dc;
  iVar19 = 1;
  uVar31 = 0;
  do {
    ppNVar1 = local_1938 + uVar31;
    uVar31 = uVar31 + 1;
    iVar19 = iVar19 + (*(uint *)&(*ppNVar1)->field_0x10 >> 0x1b) + 1;
  } while (uVar47 != uVar31);
  if (0xffff < (p->iCur & 0xffffU) + iVar19) {
    p->iCur = (p->iCur & 0xffff0000U) + 0x10000;
  }
  uVar24 = (p->vPages).nSize;
  if (uVar24 == (int)*(short *)((long)&p->iCur + 2)) {
    pvVar25 = malloc(0x40000);
    uVar23 = (p->vPages).nCap;
    if (uVar24 == uVar23) {
      if ((int)uVar23 < 0x10) {
        ppvVar26 = (p->vPages).pArray;
        if (ppvVar26 == (void **)0x0) {
          ppvVar26 = (void **)malloc(0x80);
        }
        else {
          ppvVar26 = (void **)realloc(ppvVar26,0x80);
        }
        (p->vPages).pArray = ppvVar26;
        iVar20 = 0x10;
      }
      else {
        iVar20 = uVar23 * 2;
        if (iVar20 <= (int)uVar23) goto LAB_006f4b5b;
        ppvVar26 = (p->vPages).pArray;
        if (ppvVar26 == (void **)0x0) {
          ppvVar26 = (void **)malloc((ulong)uVar23 << 4);
        }
        else {
          ppvVar26 = (void **)realloc(ppvVar26,(ulong)uVar23 << 4);
        }
        (p->vPages).pArray = ppvVar26;
      }
      (p->vPages).nCap = iVar20;
    }
LAB_006f4b5b:
    iVar20 = (p->vPages).nSize;
    (p->vPages).nSize = iVar20 + 1;
    (p->vPages).pArray[iVar20] = pvVar25;
  }
  uVar24 = p->iCur;
  p->iCur = iVar19 + uVar24;
  uVar23 = (int)uVar24 >> 0x10;
  if ((-1 < (int)uVar23) && ((int)uVar23 < (p->vPages).nSize)) {
    puVar7 = (uint *)((long)(p->vPages).pArray[uVar23] + (ulong)(uVar24 & 0xffff) * 4);
    *puVar7 = local_19dc;
    uVar31 = 0;
    do {
      pNVar29 = local_1938[uVar31];
      puVar7[1] = (*(uint *)&pNVar29->field_0x10 & 0x3ffffff) << 5 |
                  *(uint *)&pNVar29->field_0x10 >> 0x1b;
      memcpy(puVar7 + 2,pNVar29->pLeaves,(ulong)(*(uint *)&pNVar29->field_0x10 >> 0x19 & 0xfffffffc)
            );
      puVar7 = puVar7 + 1 + (*(uint *)&pNVar29->field_0x10 >> 0x1b);
      uVar31 = uVar31 + 1;
    } while (uVar47 != uVar31);
    if ((int)local_1958 < (p->vCutSets).nSize) {
      (p->vCutSets).pArray[(uint)iObj] = uVar24;
      p->CutCount[3] = (double)(int)local_19dc + p->CutCount[3];
      uVar31 = 0;
      uVar24 = 0;
      do {
        uVar24 = uVar24 + ((local_1938[uVar31]->field_0x13 & 4) == 0);
        uVar31 = uVar31 + 1;
      } while (uVar47 != uVar31);
      p->CutCount[4] = (double)(int)uVar24 + p->CutCount[4];
      p->nCutUseAll = p->nCutUseAll + (uint)(uVar24 == local_19dc);
      uVar31 = 0;
      iVar19 = 0;
      do {
        if ((*(uint *)&local_1938[uVar31]->field_0x10 >> 0x1a & 1) == 0) {
          uVar24 = *(uint *)&local_1938[uVar31]->field_0x10 >> 1 & 0x1ffffff;
          if (p->vTt2Match->nSize <= (int)uVar24) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          iVar19 = iVar19 + *(int *)((long)&p->vTt2Match->pArray->nSize + (ulong)(uVar24 << 4)) / 2;
        }
        uVar31 = uVar31 + 1;
      } while (uVar47 != uVar31);
      p->CutCount[5] = (double)iVar19 + p->CutCount[5];
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h";
  __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_006f4ee6:
  __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
}

Assistant:

void Nf_ObjMergeOrder( Nf_Man_t * p, int iObj )
{
    Nf_Cut_t pCuts0[NF_CUT_MAX], pCuts1[NF_CUT_MAX], pCuts[NF_CUT_MAX], * pCutsR[NF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    //Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    float dFlowRefs  = Nf_ObjFlowRefs(p, iObj, 0) + Nf_ObjFlowRefs(p, iObj, 1);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Nf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Nf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Nf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsUse, nCutsR = 0;
    assert( !Gia_ObjIsBuf(pObj) );
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Nf_Cut_t pCuts2[NF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Nf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Nf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Nf_Cut_t pCuts2[NF_CUT_MAX];
        int nCuts2  = Nf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Nf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Nf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Nf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Nf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( Nf_CutComputeTruthMux6(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Nf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Nf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Nf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Nf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( Nf_CutComputeTruth6(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Nf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 10000 == 0 )
//    if ( iObj == 1090 )
    {
        printf( "*** Obj = %d  Useful = %d\n", iObj, Nf_ManCountUseful(pCutsR, nCutsR) );
        for ( i = 0; i < nCutsR; i++ )
            Nf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Nf_SetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Nf_ObjSetCutFlow( p, iObj, pCutsR[0]->Flow );
    Nf_ObjSetCutDelay( p, iObj, pCutsR[0]->Delay );
    *Vec_IntEntryP(&p->vCutSets, iObj) = Nf_ManSaveCuts(p, pCutsR, nCutsR, 0);
    p->CutCount[3] += nCutsR;
    nCutsUse = Nf_ManCountUseful(pCutsR, nCutsR);
    p->CutCount[4] += nCutsUse;
    p->nCutUseAll  += nCutsUse == nCutsR;
    p->CutCount[5] += Nf_ManCountMatches(p, pCutsR, nCutsR);
}